

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lattices.cpp
# Opt level: O1

void __thiscall ValTypeLattice_Join_Test::TestBody(ValTypeLattice_Join_Test *this)

{
  Element local_58;
  Element local_50;
  Element local_48;
  Element local_40;
  ValType local_31 [8];
  ValType valtype;
  
  local_58.id = 1;
  local_50.id = 2;
  local_48.id = 4;
  local_40.id = 0;
  testDiamondJoin<wasm::analysis::ValType>(local_31,&local_58,&local_50,&local_48,&local_40);
  local_58.id = 0x58;
  local_50.id = 0x38;
  local_48.id = 0x42;
  local_40.id = 0x2a;
  testDiamondJoin<wasm::analysis::ValType>(local_31,&local_58,&local_50,&local_48,&local_40);
  return;
}

Assistant:

TEST(ValTypeLattice, Join) {
  analysis::ValType valtype;
  testDiamondJoin(valtype, Type::unreachable, Type::i32, Type::f32, Type::none);
  testDiamondJoin(valtype,
                  Type(HeapType::none, NonNullable),
                  Type(HeapType::struct_, NonNullable),
                  Type(HeapType::array, Nullable),
                  Type(HeapType::eq, Nullable));
}